

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_POP_NSP(State *state,Instruction *instr)

{
  size_type sVar1;
  Instruction *this;
  reference this_00;
  Variable *v;
  Variable local_28;
  Instruction *local_18;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  local_18 = instr;
  instr_local = (Instruction *)state;
  sVar1 = std::
          vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
          ::size(&state->rets);
  if (sVar1 != 0) {
    this = instr_local + 9;
    this_00 = std::
              vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
              ::back((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                      *)&instr_local[7].comp_value);
    v = Nullable<LiteScript::Variable>::operator*(this_00);
    Variable::Variable(&local_28,v);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)this,&local_28
              );
    Variable::~Variable(&local_28);
    std::
    vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
    ::pop_back((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                *)&instr_local[7].comp_value);
  }
  sVar1 = std::
          vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
          ::size((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                  *)(instr_local + 6));
  if (sVar1 != 0) {
    std::
    vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
    ::pop_back((vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                *)(instr_local + 6));
  }
  sVar1 = std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::size
                    ((vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_> *)
                     (instr_local + 0xc));
  if (1 < sVar1) {
    std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::pop_back
              ((vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_> *)(instr_local + 0xc))
    ;
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_POP_NSP(State& state, Instruction& instr) {
    state.line_num++;
    if (state.rets.size() > 0) {
        state.op_lifo.push_back(Variable(*state.rets.back()));
        state.rets.pop_back();
    }
    if (state.ths.size() > 0)
        state.ths.pop_back();
    if (state.nsp_lifo.size() > 1)
        state.nsp_lifo.pop_back();
}